

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_c11_unittests.cc
# Opt level: O1

void __thiscall
DenseHashMapMoveTest_EraseConstIterator_Test::TestBody
          (DenseHashMapMoveTest_EraseConstIterator_Test *this)

{
  pointer ppVar1;
  const_iterator pos;
  value_type *pvVar2;
  long lVar3;
  pointer ppVar4;
  pair<const_int,_int> message;
  undefined1 in_R9B;
  undefined7 in_register_00000089;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  AssertHelper local_b8;
  pointer local_b0;
  iterator local_a8;
  AssertHelper local_90;
  undefined1 local_88 [32];
  dense_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  local_68;
  
  local_68.settings.super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
  consider_shrink_ = false;
  local_68.settings.super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
  num_ht_copies_ = 0;
  local_68.settings.super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
  enlarge_factor_ = 0.5;
  local_68.settings.super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
  shrink_factor_ = 0.2;
  local_68.num_deleted = 0;
  local_68.num_elements = 0;
  local_68.num_buckets = (size_type)&DAT_00000020;
  local_68.table = (pointer)0x0;
  local_68.settings.super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
  enlarge_threshold_ = 0x10;
  local_68.settings.super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.
  shrink_threshold_ = 6;
  local_68.settings.super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.use_empty_ =
       true;
  local_68.settings.super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.use_deleted_
       = false;
  local_68.key_info.delkey = 0;
  local_68.key_info.empty_key = 0;
  local_68.table = (pointer)malloc(0x100);
  memset(local_68.table,0,0x100);
  google::
  dense_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::squash_deleted(&local_68);
  local_68.settings.super_sh_hashtable_settings<int,_std::hash<int>,_unsigned_long,_4>.use_deleted_
       = true;
  local_68.key_info.delkey = -1;
  local_88._0_4_ = 1;
  pvVar2 = google::
           dense_hashtable<std::pair<int_const,int>,int,std::hash<int>,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SelectKey,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>
           ::find_or_insert<int,int>
                     ((dense_hashtable<std::pair<int_const,int>,int,std::hash<int>,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SelectKey,google::dense_hash_map<int,int,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SetKey,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,int>>>
                       *)&local_68,(int *)local_88);
  pvVar2->second = 1;
  ppVar1 = local_68.table + local_68.num_buckets;
  local_88._8_8_ = local_68.table;
  if ((undefined1 *)local_68.num_buckets != (undefined1 *)0x0) {
    lVar3 = local_68.num_buckets << 3;
    do {
      in_R9B = local_68.key_info.delkey == ((pointer)local_88._8_8_)->first;
      if ((local_68.key_info.empty_key != ((pointer)local_88._8_8_)->first) &&
         (local_68.num_deleted == 0 || !(bool)in_R9B)) break;
      local_88._8_8_ = local_88._8_8_ + 8;
      lVar3 = lVar3 + -8;
    } while (lVar3 != 0);
  }
  pos.pos = (pointer)local_88._8_8_;
  pos.ht = &local_68;
  pos.end = ppVar1;
  local_88._0_8_ = &local_68;
  local_88._16_8_ = ppVar1;
  google::
  dense_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  ::erase(&local_a8,&local_68,pos);
  local_b8.data_._0_4_ = CONCAT31(local_b8.data_._1_3_,ppVar1 == local_a8.pos);
  local_b0 = (pointer)0x0;
  if (ppVar1 == local_a8.pos) {
    local_a8.ht._0_4_ = 0;
    local_b8.data_._0_4_ = (int)local_68.num_elements - (int)local_68.num_deleted;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_88,"0","(int)h.size()",(int *)&local_a8,(int *)&local_b8);
    ppVar4 = (pointer)local_88._8_8_;
    if (local_88[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_a8);
      if ((pointer)local_88._8_8_ == (pointer)0x0) {
        message = (pair<const_int,_int>)((long)"%s from %s (%s ms total)\n\n" + 0x1a);
      }
      else {
        message = *(pair<const_int,_int> *)local_88._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_b8,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_c11_unittests.cc"
                 ,0x17c,(char *)message);
      testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_a8);
      testing::internal::AssertHelper::~AssertHelper(&local_b8);
      ppVar4 = (pointer)local_88._8_8_;
      if ((long *)CONCAT44(local_a8.ht._4_4_,local_a8.ht._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_a8.ht._4_4_,local_a8.ht._0_4_) + 8))();
        ppVar4 = (pointer)local_88._8_8_;
      }
    }
  }
  else {
    testing::Message::Message((Message *)&local_a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_88,(internal *)&local_b8,(AssertionResult *)"h.end() == h.erase(it)",
               "false","true",(char *)CONCAT71(in_register_00000089,in_R9B));
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_c11_unittests.cc"
               ,0x17b,(char *)local_88._0_8_);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    if ((dense_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
         *)local_88._0_8_ !=
        (dense_hashtable<std::pair<const_int,_int>,_int,_std::hash<int>,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<int,_int,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
         *)(local_88 + 0x10)) {
      operator_delete((void *)local_88._0_8_);
    }
    ppVar4 = local_b0;
    if ((long *)CONCAT44(local_a8.ht._4_4_,local_a8.ht._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_a8.ht._4_4_,local_a8.ht._0_4_) + 8))();
      ppVar4 = local_b0;
    }
  }
  if (ppVar4 != (pointer)0x0) {
    if (*ppVar4 != (pair<const_int,_int>)(ppVar4 + 2)) {
      operator_delete((void *)*ppVar4);
    }
    operator_delete(ppVar4);
  }
  if (local_68.table != (pointer)0x0) {
    free(local_68.table);
  }
  return;
}

Assistant:

TEST(DenseHashMapMoveTest, EraseConstIterator)
{
    dense_hash_map<int, int> h;
    h.set_empty_key(0);
    h.set_deleted_key(-1);

    h[1] = 1;
    const auto it = h.begin();
    ASSERT_TRUE(h.end() == h.erase(it));
    ASSERT_EQ(0, (int)h.size());
}